

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monmove.c
# Opt level: O1

int dochugw(monst *mtmp)

{
  uint uVar1;
  bool bVar2;
  boolean bVar3;
  int iVar4;
  obj *poVar5;
  int iVar6;
  int y0;
  
  iVar6 = (int)mtmp->mx;
  y0 = (int)mtmp->my;
  if (occupation == (_func_int *)0x0) {
    bVar2 = true;
  }
  else {
    if (mtmp->wormno == '\0') {
      if (((viz_array[y0][iVar6] & 2U) != 0) ||
         (((((u.uprops[0x1e].intrinsic == 0 &&
             (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
            ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
           ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
            (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
          (((viz_array[y0][iVar6] & 1U) != 0 && ((mtmp->data->mflags3 & 0x200) != 0))))))
      goto LAB_001ed16d;
LAB_001ed1c2:
      if (((mtmp->data->mflags1 & 0x10000) == 0) &&
         ((poVar5 = which_armor(mtmp,4), poVar5 == (obj *)0x0 ||
          (poVar5 = which_armor(mtmp,4), poVar5->otyp != 0x4f)))) {
        if (((u.uprops[0x1e].intrinsic == 0) &&
            (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
             (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
           (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
            ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
              (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
              youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) {
          if ((u.uprops[0x19].extrinsic == 0) || (u.uprops[0x19].blocked != 0)) goto LAB_001ed300;
          iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
          bVar2 = false;
          if ((iVar4 < 0x41) || (bVar2 = false, u.uprops[0x42].intrinsic != 0)) goto LAB_001ed32d;
          goto LAB_001ed316;
        }
      }
      else {
LAB_001ed300:
        if (u.uprops[0x42].intrinsic == 0) {
LAB_001ed316:
          if (u.uprops[0x42].extrinsic == 0) {
            bVar3 = match_warn_of_mon(mtmp);
            bVar2 = bVar3 == '\0';
            goto LAB_001ed32d;
          }
        }
      }
    }
    else {
      bVar3 = worm_known(level,mtmp);
      if (bVar3 == '\0') goto LAB_001ed1c2;
LAB_001ed16d:
      uVar1 = *(uint *)&mtmp->field_0x60;
      if ((((uVar1 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0))
      {
        if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
        goto LAB_001ed1b5;
        goto LAB_001ed1c2;
      }
      if ((uVar1 & 0x280) != 0) goto LAB_001ed1c2;
LAB_001ed1b5:
      if ((u._1052_1_ & 0x20) != 0) goto LAB_001ed1c2;
    }
    bVar2 = false;
  }
LAB_001ed32d:
  iVar4 = dochug(mtmp);
  if (occupation == (_func_int *)0x0) {
    return iVar4;
  }
  if (iVar4 != 0) {
    return iVar4;
  }
  if (u.uprops[0x1c].intrinsic != 0) {
    return 0;
  }
  if ((mtmp->field_0x62 & 0x40) != 0) {
    if (u.uprops[0x23].intrinsic == 0) {
      return 0;
    }
    if (u.uprops[0x24].extrinsic != 0) {
      return 0;
    }
    if ((u.umonnum != u.umonster) && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')) {
      return 0;
    }
  }
  iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
  if (0x51 < iVar4) {
    return 0;
  }
  if (((!bVar2) && ((viz_array[y0][iVar6] & 1U) != 0)) &&
     (iVar6 = dist2(iVar6,y0,(int)u.ux,(int)u.uy), iVar6 < 0x52)) {
    return 0;
  }
  if (mtmp->wormno == '\0') {
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
       (((((u.uprops[0x1e].intrinsic == 0 && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
          (((youmonst.data)->mflags3 & 0x100) != 0)) &&
         (((viz_array[mtmp->my][mtmp->mx] & 1U) != 0 && ((mtmp->data->mflags3 & 0x200) != 0))))))))
    goto LAB_001ed509;
  }
  else {
    bVar3 = worm_known(level,mtmp);
    if (bVar3 != '\0') {
LAB_001ed509:
      uVar1 = *(uint *)&mtmp->field_0x60;
      if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar1 & 0x280) == 0) {
LAB_001ed549:
          if ((u._1052_1_ & 0x20) == 0) goto LAB_001ed6cf;
        }
      }
      else if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_001ed549;
    }
  }
  if (((((mtmp->data->mflags1 & 0x10000) != 0) ||
       ((poVar5 = which_armor(mtmp,4), poVar5 != (obj *)0x0 &&
        (poVar5 = which_armor(mtmp,4), poVar5->otyp == 0x4f)))) ||
      ((((u.uprops[0x1e].intrinsic == 0 &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
         ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
           (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
           youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) &&
       (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
        (iVar6 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar6)))))) &&
     (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
      (bVar3 = match_warn_of_mon(mtmp), bVar3 == '\0')))) {
    return 0;
  }
  if ((viz_array[mtmp->my][mtmp->mx] & 1U) == 0) {
    return 0;
  }
LAB_001ed6cf:
  if ((((mtmp->field_0x62 & 4) != 0) && (iVar6 = noattacks(mtmp->data), iVar6 == 0)) &&
     (bVar3 = onscary((int)u.ux,(int)u.uy,mtmp), bVar3 == '\0')) {
    stop_occupation();
  }
  return 0;
}

Assistant:

int dochugw(struct monst *mtmp)
{
	int x = mtmp->mx, y = mtmp->my;
	boolean already_saw_mon = !occupation ? 0 : canspotmon(level, mtmp);
	int rd = dochug(mtmp);

	/* a similar check is in monster_nearby() in hack.c */
	/* check whether hero notices monster and stops current activity */
	if (occupation && !rd && !Confusion &&
	    (!mtmp->mpeaceful || Hallucination) &&
	    /* it's close enough to be a threat */
	    distu(mtmp->mx,mtmp->my) <= (BOLT_LIM+1)*(BOLT_LIM+1) &&
	    /* and either couldn't see it before, or it was too far away */
	    (!already_saw_mon || !couldsee(x,y) ||
		distu(x,y) > (BOLT_LIM+1)*(BOLT_LIM+1)) &&
	    /* can see it now, or sense it and would normally see it */
	    (canseemon(level, mtmp) ||
		(sensemon(mtmp) && couldsee(mtmp->mx,mtmp->my))) &&
	    mtmp->mcanmove &&
	    !noattacks(mtmp->data) && !onscary(u.ux, u.uy, mtmp))
		stop_occupation();

	return rd;
}